

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_bddComputeCube(DdManager *dd,DdNode **vars,int *phase,int n)

{
  int local_44;
  DdNode *pDStack_40;
  int i;
  DdNode *fn;
  DdNode *cube;
  int n_local;
  int *phase_local;
  DdNode **vars_local;
  DdManager *dd_local;
  
  fn = dd->one;
  *(int *)(((ulong)fn & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)fn & 0xfffffffffffffffe) + 4) + 1;
  local_44 = n + -1;
  while( true ) {
    if (local_44 < 0) {
      *(int *)(((ulong)fn & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)fn & 0xfffffffffffffffe) + 4) + -1;
      return fn;
    }
    if ((phase == (int *)0x0) || (phase[local_44] != 0)) {
      pDStack_40 = Cudd_bddAnd(dd,vars[local_44],fn);
    }
    else {
      pDStack_40 = Cudd_bddAnd(dd,(DdNode *)((ulong)vars[local_44] ^ 1),fn);
    }
    if (pDStack_40 == (DdNode *)0x0) break;
    *(int *)(((ulong)pDStack_40 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDStack_40 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,fn);
    fn = pDStack_40;
    local_44 = local_44 + -1;
  }
  Cudd_RecursiveDeref(dd,fn);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddComputeCube(
  DdManager * dd,
  DdNode ** vars,
  int * phase,
  int  n)
{
    DdNode      *cube;
    DdNode      *fn;
    int         i;

    cube = DD_ONE(dd);
    cuddRef(cube);

    for (i = n - 1; i >= 0; i--) {
        if (phase == NULL || phase[i] != 0) {
            fn = Cudd_bddAnd(dd,vars[i],cube);
        } else {
            fn = Cudd_bddAnd(dd,Cudd_Not(vars[i]),cube);
        }
        if (fn == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(fn);
        Cudd_RecursiveDeref(dd,cube);
        cube = fn;
    }
    cuddDeref(cube);

    return(cube);

}